

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

int __thiscall despot::QNode::PolicyTreeSize(QNode *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Self __tmp;
  
  iVar3 = 0;
  for (p_Var2 = (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->children_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = VNode::PolicyTreeSize((VNode *)p_Var2[1]._M_parent);
    iVar3 = iVar3 + iVar1;
  }
  return iVar3 + 1;
}

Assistant:

int QNode::PolicyTreeSize() const {
	int size = 0;
	for (map<OBS_TYPE, VNode*>::const_iterator it = children_.begin();
		it != children_.end(); it++) {
		size += it->second->PolicyTreeSize();
	}
	return 1 + size;
}